

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::ExtensionSet::ShouldRegisterAtThisTime
          (ExtensionSet *this,
          initializer_list<google::protobuf::internal::ExtensionSet::WeakPrototypeRef> messages,
          bool is_preregistration)

{
  Message *pMVar1;
  long lVar2;
  bool bVar3;
  
  if (messages._M_array == (iterator)0x0) {
    bVar3 = true;
  }
  else {
    bVar3 = true;
    lVar2 = 0;
    do {
      if (bVar3) {
        pMVar1 = GetPrototypeForWeakDescriptor
                           (*(DescriptorTable **)((long)&this->arena_ + lVar2),
                            *(int *)((long)&this->flat_capacity_ + lVar2),false);
        bVar3 = pMVar1 != (Message *)0x0;
      }
      else {
        bVar3 = false;
      }
      lVar2 = lVar2 + 0x10;
    } while ((long)messages._M_array << 4 != lVar2);
  }
  return (bool)(bVar3 ^ (byte)messages._M_len ^ 1);
}

Assistant:

bool ExtensionSet::ShouldRegisterAtThisTime(
    std::initializer_list<WeakPrototypeRef> messages, bool is_preregistration) {
  bool has_all = true;
  for (auto ref : messages) {
    has_all = has_all && GetPrototypeForWeakDescriptor(ref.table, ref.index,
                                                       false) != nullptr;
  }
  return has_all == is_preregistration;
}